

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void warn_equality_value(ly_ctx *ctx,lyxp_expr *exp,lyxp_set *set,uint16_t val_exp,
                        uint16_t equal_exp,uint16_t last_equal_exp)

{
  char *pcVar1;
  lys_module *plVar2;
  int_log_opts local_40;
  int local_3c;
  int_log_opts prev_ilo;
  int ret;
  char *value;
  lys_node *snode;
  uint16_t last_equal_exp_local;
  uint16_t equal_exp_local;
  lyxp_set *plStack_20;
  uint16_t val_exp_local;
  lyxp_set *set_local;
  lyxp_expr *exp_local;
  ly_ctx *ctx_local;
  
  snode._2_2_ = last_equal_exp;
  snode._4_2_ = equal_exp;
  snode._6_2_ = val_exp;
  plStack_20 = set;
  set_local = (lyxp_set *)exp;
  exp_local = (lyxp_expr *)ctx;
  value = (char *)warn_get_snode_in_ctx(set);
  if ((((lys_node *)value != (lys_node *)0x0) &&
      ((((lys_node *)value)->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN)) &&
     ((*(int *)(*(long *)set_local + (ulong)snode._6_2_ * 4) == 0x11 ||
      (*(int *)(*(long *)set_local + (ulong)snode._6_2_ * 4) == 0x12)))) {
    if (*(int *)(*(long *)set_local + (ulong)snode._6_2_ * 4) == 0x11) {
      _prev_ilo = strndup((char *)((long)&set_local->ht->used +
                                  (long)(int)(uint)*(ushort *)
                                                    (*(long *)&set_local->field_0x8 +
                                                    (ulong)snode._6_2_ * 2) + 1),
                          (long)(int)(*(ushort *)
                                       ((long)&((set_local->val).nodes)->node +
                                       (ulong)snode._6_2_ * 2) - 2));
    }
    else {
      _prev_ilo = strndup((char *)((long)&set_local->ht->used +
                                  (long)(int)(uint)*(ushort *)
                                                    (*(long *)&set_local->field_0x8 +
                                                    (ulong)snode._6_2_ * 2)),
                          (ulong)*(ushort *)
                                  ((long)&((set_local->val).nodes)->node + (ulong)snode._6_2_ * 2));
    }
    if (_prev_ilo == (char *)0x0) {
      ly_log((ly_ctx *)exp_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "warn_equality_value");
    }
    else {
      if ((*(int *)(value + 0x80) == 7) && (pcVar1 = strchr(_prev_ilo,0x3a), pcVar1 == (char *)0x0))
      {
        ly_log((ly_ctx *)exp_local,LY_LLWRN,LY_SUCCESS,
               "Identityref \"%s\" comparison with identity \"%s\" without prefix, consider adding a prefix or best using \"derived-from(-or-self)()\" functions."
               ,*(undefined8 *)value,_prev_ilo);
        ly_log((ly_ctx *)exp_local,LY_LLWRN,LY_SUCCESS,
               "Previous warning generated by XPath subexpression[%u] \"%.*s\".",
               (ulong)*(ushort *)(*(long *)&set_local->field_0x8 + (ulong)snode._4_2_ * 2),
               (ulong)(((uint)*(ushort *)(*(long *)&set_local->field_0x8 + (ulong)snode._2_2_ * 2) -
                       (uint)*(ushort *)(*(long *)&set_local->field_0x8 + (ulong)snode._4_2_ * 2)) +
                      (uint)*(ushort *)
                             ((long)&((set_local->val).nodes)->node + (ulong)snode._2_2_ * 2)),
               (long)&set_local->ht->used +
               (long)(int)(uint)*(ushort *)(*(long *)&set_local->field_0x8 + (ulong)snode._4_2_ * 2)
              );
      }
      if ((*(int *)(value + 0x80) != 7) ||
         (plVar2 = lys_node_module((lys_node *)value),
         (*(ushort *)&plVar2->field_0x40 >> 7 & 1) != 0)) {
        ly_ilo_change((ly_ctx *)0x0,ILO_ERR2WRN,&local_40,(ly_err_item **)0x0);
        local_3c = lyd_validate_value((lys_node *)value,_prev_ilo);
        ly_ilo_restore((ly_ctx *)0x0,local_40,(ly_err_item *)0x0,0);
        if (local_3c != 0) {
          ly_log((ly_ctx *)exp_local,LY_LLWRN,LY_SUCCESS,
                 "Previous warning generated by XPath subexpression[%u] \"%.*s\".",
                 (ulong)*(ushort *)(*(long *)&set_local->field_0x8 + (ulong)snode._4_2_ * 2),
                 (ulong)(((uint)*(ushort *)(*(long *)&set_local->field_0x8 + (ulong)snode._2_2_ * 2)
                         - (uint)*(ushort *)
                                  (*(long *)&set_local->field_0x8 + (ulong)snode._4_2_ * 2)) +
                        (uint)*(ushort *)
                               ((long)&((set_local->val).nodes)->node + (ulong)snode._2_2_ * 2)),
                 (long)&set_local->ht->used +
                 (long)(int)(uint)*(ushort *)
                                   (*(long *)&set_local->field_0x8 + (ulong)snode._4_2_ * 2));
        }
      }
      free(_prev_ilo);
    }
  }
  return;
}

Assistant:

static void
warn_equality_value(struct ly_ctx *ctx, struct lyxp_expr *exp, struct lyxp_set *set, uint16_t val_exp, uint16_t equal_exp,
                    uint16_t last_equal_exp)
{
    struct lys_node *snode;
    char *value;
    int ret;
    enum int_log_opts prev_ilo;

    if ((snode = warn_get_snode_in_ctx(set)) && (snode->nodetype & (LYS_LEAF | LYS_LEAFLIST))
            && ((exp->tokens[val_exp] == LYXP_TOKEN_LITERAL) || (exp->tokens[val_exp] == LYXP_TOKEN_NUMBER))) {
        /* check that the node can have the specified value */
        if (exp->tokens[val_exp] == LYXP_TOKEN_LITERAL) {
            value = strndup(exp->expr + exp->expr_pos[val_exp] + 1, exp->tok_len[val_exp] - 2);
        } else {
            value = strndup(exp->expr + exp->expr_pos[val_exp], exp->tok_len[val_exp]);
        }
        if (!value) {
            LOGMEM(ctx);
            return;
        }

        if ((((struct lys_node_leaf *)snode)->type.base == LY_TYPE_IDENT) && !strchr(value, ':')) {
            LOGWRN(ctx, "Identityref \"%s\" comparison with identity \"%s\" without prefix, consider adding"
                   " a prefix or best using \"derived-from(-or-self)()\" functions.", snode->name, value);
            LOGWRN(ctx, "Previous warning generated by XPath subexpression[%u] \"%.*s\".", exp->expr_pos[equal_exp],
                   (exp->expr_pos[last_equal_exp] - exp->expr_pos[equal_exp]) + exp->tok_len[last_equal_exp],
                   exp->expr + exp->expr_pos[equal_exp]);
        }

        /* we are unable to check identityref validity if this module (and any required imports) are not implemented */
        if ((((struct lys_node_leaf *)snode)->type.base != LY_TYPE_IDENT) || lys_node_module(snode)->implemented) {
            /* we want to print our message and more importantly a warning, not an error */
            ly_ilo_change(NULL, ILO_ERR2WRN, &prev_ilo, NULL);
            ret = lyd_validate_value(snode, value);
            ly_ilo_restore(NULL, prev_ilo, NULL, 0);
            if (ret) {
                LOGWRN(ctx, "Previous warning generated by XPath subexpression[%u] \"%.*s\".", exp->expr_pos[equal_exp],
                    (exp->expr_pos[last_equal_exp] - exp->expr_pos[equal_exp]) + exp->tok_len[last_equal_exp],
                    exp->expr + exp->expr_pos[equal_exp]);
            }
        }
        free(value);
    }
}